

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O1

void __thiscall OSTEIDeriv1_Writer::Write_Permutations_(OSTEIDeriv1_Writer *this)

{
  OSTEI_GeneratorInfo *pOVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QAM am;
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  _Alloc_hider local_98;
  char local_88 [16];
  undefined1 local_78 [16];
  _Alloc_hider local_68;
  char local_58 [16];
  undefined1 local_48 [16];
  _Alloc_hider local_38;
  char local_28 [16];
  
  pOVar1 = (this->super_OSTEI_Writer_Base).info_;
  iVar3 = (pOVar1->super_GeneratorInfoBase).finalam_.qam._M_elems[0];
  iVar4 = (pOVar1->super_GeneratorInfoBase).finalam_.qam._M_elems[1];
  iVar5 = (pOVar1->super_GeneratorInfoBase).finalam_.qam._M_elems[2];
  iVar6 = (pOVar1->super_GeneratorInfoBase).finalam_.qam._M_elems[3];
  pcVar2 = (pOVar1->super_GeneratorInfoBase).finalam_.tag._M_dataplus._M_p;
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,
             pcVar2 + (pOVar1->super_GeneratorInfoBase).finalam_.tag._M_string_length);
  local_48._0_4_ = iVar3;
  local_48._4_4_ = iVar4;
  local_48._8_4_ = iVar5;
  local_48._12_4_ = iVar6;
  local_38._M_p = local_28;
  std::__cxx11::string::_M_construct<char*>((string *)&local_38,local_c8,local_c8 + local_c0);
  Write_Permute_(this,(QAM *)local_48,true,false);
  if (local_38._M_p != local_28) {
    operator_delete(local_38._M_p);
  }
  local_78._0_4_ = iVar3;
  local_78._4_4_ = iVar4;
  local_78._8_4_ = iVar5;
  local_78._12_4_ = iVar6;
  local_68._M_p = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_c8,local_c8 + local_c0);
  Write_Permute_(this,(QAM *)local_78,false,true);
  if (local_68._M_p != local_58) {
    operator_delete(local_68._M_p);
  }
  local_a8._0_4_ = iVar3;
  local_a8._4_4_ = iVar4;
  local_a8._8_4_ = iVar5;
  local_a8._12_4_ = iVar6;
  local_98._M_p = local_88;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_c8,local_c8 + local_c0);
  Write_Permute_(this,(QAM *)local_a8,true,true);
  if (local_98._M_p != local_88) {
    operator_delete(local_98._M_p);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  return;
}

Assistant:

void OSTEIDeriv1_Writer::Write_Permutations_(void) const
{
    ///////////////////////////////////////////////////////////
    // Note that we never permute bra, ket. That would
    // affect vectorization since we only vectorize on the ket
    ///////////////////////////////////////////////////////////
    QAM am = info_.FinalAM();

    // permute 1,2
    Write_Permute_(am, true, false);

    // permute 3,4
    Write_Permute_(am, false, true);

    // permute 1,2 and 3,4
    Write_Permute_(am, true, true);
}